

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nagel.c
# Opt level: O2

void filter(qnode_ptr_t p,qnode_ptr_t q,float trsh)

{
  disp_vect_t *pdVar1;
  int iVar2;
  long lVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  undefined4 in_XMM0_Db;
  
  iVar2 = p->sizy;
  if (p->sizy < 1) {
    iVar2 = 0;
  }
  for (iVar4 = 0; iVar4 != iVar2; iVar4 = iVar4 + 1) {
    iVar5 = p->sizx;
    if (p->sizx < 1) {
      iVar5 = 0;
    }
    for (lVar6 = 0; iVar5 != (int)lVar6; lVar6 = lVar6 + 1) {
      lVar3 = (long)q->res * (long)iVar4 + lVar6;
      if (((*q->param_ptr[q->sizz / 2])[lVar3].mag <= (float)(double)CONCAT44(in_XMM0_Db,trsh)) ||
         ((*q->param_ptr[q->sizz / 2])[lVar3].err != 0)) {
        pdVar1 = *p->flow_ptr + (long)p->res * (long)iVar4 + lVar6;
        pdVar1->x = -100.0;
        pdVar1->y = 100.0;
      }
    }
  }
  return;
}

Assistant:

void filter(p,q,trsh)
qnode_ptr_t p, q ;
float trsh ;

{ param_t P ;
  disp_vect_t Uerr ;
  int i, j ;

  Uerr.x = -100.0 ;
  Uerr.y = 100.0 ;

  for (i = 0 ; i < p->sizy ; i++) {
    for (j = 0 ; j < p->sizx ; j++) {
      P = (*q->param_ptr[q->sizz/2])[q->res*i + j] ;
      if (P.mag <= trsh || P.err != NO_ERROR) {
        (*p->flow_ptr)[p->res*i + j] = Uerr ;
      }
    }
  }
}